

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O0

Time helics::fileops::loadTomlTime(value *timeElement,time_units defaultUnits)

{
  string_view timeString;
  string_view timeString_00;
  bool bVar1;
  time_units in_ESI;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> val;
  value emptyVal;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *units;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unit;
  basic_value<toml::type_config> *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  time_units in_stack_fffffffffffffd34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  nanoseconds in_stack_fffffffffffffd40;
  basic_value<toml::type_config> *in_stack_fffffffffffffd58;
  basic_value<toml::type_config> *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  basic_value<toml::type_config> *opt;
  basic_value<toml::type_config> *in_stack_fffffffffffffd70;
  basic_value<toml::type_config> *in_stack_fffffffffffffd78;
  string_view in_stack_fffffffffffffe70;
  value *in_stack_fffffffffffffec8;
  basic_value<toml::type_config> local_110;
  __sv_type local_48;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  local_38;
  __sv_type local_30;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  local_20;
  time_units local_14;
  baseType local_8;
  
  local_14 = in_ESI;
  bVar1 = toml::basic_value<toml::type_config>::is_table((basic_value<toml::type_config> *)0x709243)
  ;
  if (bVar1) {
    local_20 = toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                         (in_stack_fffffffffffffd78,(char (*) [5])in_stack_fffffffffffffd70,
                          in_stack_fffffffffffffd68);
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x70927c);
    if (!bVar1) {
      local_30 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      local_14 = gmlc::utilities::timeUnitsFromString(in_stack_fffffffffffffe70);
    }
    local_38 = toml::find_or<std::__cxx11::string,toml::type_config,char[6]>
                         (in_stack_fffffffffffffd78,(char (*) [6])in_stack_fffffffffffffd70,
                          in_stack_fffffffffffffd68);
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7092e9);
    if (!bVar1) {
      local_48 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      local_14 = gmlc::utilities::timeUnitsFromString(in_stack_fffffffffffffe70);
    }
    opt = &local_110;
    toml::basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)
               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    toml::find_or<toml::type_config,char[6]>
              (in_stack_fffffffffffffd78,(char (*) [6])in_stack_fffffffffffffd70,opt);
    toml::basic_value<toml::type_config>::basic_value
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    bVar1 = toml::basic_value<toml::type_config>::is_empty
                      ((basic_value<toml::type_config> *)0x709370);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      bVar1 = toml::basic_value<toml::type_config>::is_integer
                        ((basic_value<toml::type_config> *)0x709385);
      if (bVar1) {
        toml::basic_value<toml::type_config>::as_integer(in_stack_fffffffffffffd70);
        TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                  ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffd40.__r,
                   (int64_t)in_stack_fffffffffffffd38,in_stack_fffffffffffffd34);
        bVar1 = true;
      }
      else {
        bVar1 = toml::basic_value<toml::type_config>::is_floating
                          ((basic_value<toml::type_config> *)0x70940a);
        if (bVar1) {
          toml::basic_value<toml::type_config>::as_floating(in_stack_fffffffffffffd70);
          toSecondMultiplier(local_14);
          TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                    ((TimeRepresentation<count_time<9,_long>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     (double)in_stack_fffffffffffffd28);
          bVar1 = true;
        }
        else {
          tomlAsString_abi_cxx11_(in_stack_fffffffffffffec8);
          std::operator+(in_stack_fffffffffffffd38,
                         (char *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
          std::operator+(in_stack_fffffffffffffd38,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
          timeString._M_len._4_4_ = in_stack_fffffffffffffd34;
          timeString._M_len._0_4_ = in_stack_fffffffffffffd30;
          timeString._M_str = (char *)in_stack_fffffffffffffd38;
          local_8 = (baseType)
                    gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                              (timeString);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
          bVar1 = true;
        }
      }
    }
    toml::basic_value<toml::type_config>::~basic_value
              ((basic_value<toml::type_config> *)
               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    toml::basic_value<toml::type_config>::~basic_value
              ((basic_value<toml::type_config> *)
               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    if (!bVar1) {
      local_8 = (baseType)TimeRepresentation<count_time<9,_long>_>::minVal();
    }
  }
  else {
    bVar1 = toml::basic_value<toml::type_config>::is_integer
                      ((basic_value<toml::type_config> *)0x709613);
    if (bVar1) {
      toml::basic_value<toml::type_config>::as_integer(in_stack_fffffffffffffd70);
      TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffd40.__r,
                 (int64_t)in_stack_fffffffffffffd38,in_stack_fffffffffffffd34);
    }
    else {
      bVar1 = toml::basic_value<toml::type_config>::is_floating
                        ((basic_value<toml::type_config> *)0x70964f);
      if (bVar1) {
        toml::basic_value<toml::type_config>::as_floating(in_stack_fffffffffffffd70);
        toSecondMultiplier(local_14);
        TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                  ((TimeRepresentation<count_time<9,_long>_> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   (double)in_stack_fffffffffffffd28);
      }
      else {
        bVar1 = toml::basic_value<toml::type_config>::is_local_time
                          ((basic_value<toml::type_config> *)0x7096a4);
        if (bVar1) {
          toml::get<std::chrono::duration<long,std::ratio<1l,1000000000l>>,toml::type_config>
                    (in_stack_fffffffffffffd28);
          TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
                    ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffd38,
                     in_stack_fffffffffffffd40);
        }
        else {
          tomlAsString_abi_cxx11_(in_stack_fffffffffffffec8);
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
          timeString_00._M_len._4_4_ = in_stack_fffffffffffffd34;
          timeString_00._M_len._0_4_ = in_stack_fffffffffffffd30;
          timeString_00._M_str = (char *)in_stack_fffffffffffffd38;
          local_8 = (baseType)
                    gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                              (timeString_00);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8);
        }
      }
    }
  }
  return (Time)local_8;
}

Assistant:

helics::Time loadTomlTime(const toml::value& timeElement, time_units defaultUnits)
{
    if (timeElement.is_table()) {
        const auto& unit = toml::find_or<std::string>(timeElement, "unit", emptyString);
        if (!unit.empty()) {
            defaultUnits = gmlc::utilities::timeUnitsFromString(unit);
        }
        const auto& units = toml::find_or<std::string>(timeElement, "units", emptyString);
        if (!units.empty()) {
            defaultUnits = gmlc::utilities::timeUnitsFromString(units);
        }
        const toml::value emptyVal;
        auto val = toml::find_or(timeElement, "value", emptyVal);
        if (!val.is_empty()) {
            if (val.is_integer()) {
                return {val.as_integer(), defaultUnits};
            }
            if (val.is_floating()) {
                return {val.as_floating() * toSecondMultiplier(defaultUnits)};
            }
            return gmlc::utilities::loadTimeFromString<helics::Time>(tomlAsString(val) + " " +
                                                                     units);
        }
    } else if (timeElement.is_integer()) {
        return {timeElement.as_integer(), defaultUnits};
    } else if (timeElement.is_floating()) {
        return {timeElement.as_floating() * toSecondMultiplier(defaultUnits)};
    } else if (timeElement.is_local_time()) {
        return {toml::get<std::chrono::nanoseconds>(timeElement)};
    } else {
        return gmlc::utilities::loadTimeFromString<helics::Time>(tomlAsString(timeElement));
    }
    return helics::Time::minVal();
}